

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QDate __thiscall QDate::addYears(QDate *this,int nyears,QCalendar cal)

{
  QDate date;
  bool bVar1;
  int iVar2;
  undefined8 in_RDX;
  int in_ESI;
  QCalendarBackend *in_RDI;
  long in_FS_OFFSET;
  YearMonthDay YVar3;
  int old_y;
  YearMonthDay parts;
  QCalendar cal_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined8 local_40;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined1 *local_28;
  int local_20;
  undefined4 uStack_14;
  qint64 local_10;
  long local_8;
  
  uStack_14 = (undefined4)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  cal_00.d_ptr = in_RDI;
  bVar1 = isValid((QDate *)in_RDI);
  if (bVar1) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = -0x55555556;
    date.jd._4_4_ = in_stack_ffffffffffffffcc;
    date.jd._0_4_ = in_stack_ffffffffffffffc8;
    YVar3 = QCalendar::partsFromDate
                      ((QCalendar *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       date);
    local_40 = YVar3._0_8_;
    local_20 = YVar3.day;
    local_28 = (undefined1 *)local_40;
    bVar1 = QCalendar::YearMonthDay::isValid((YearMonthDay *)&local_28);
    if (bVar1) {
      iVar2 = (int)local_28;
      local_28 = (undefined1 *)CONCAT44(local_28._4_4_,in_ESI + (int)local_28);
      bVar1 = QCalendar::hasYearZero((QCalendar *)cal_00.d_ptr);
      if ((!bVar1) && ((0 < iVar2 != 0 < (int)local_28 || ((int)local_28 == 0)))) {
        iVar2 = -1;
        if (0 < in_ESI) {
          iVar2 = 1;
        }
        local_28 = (undefined1 *)CONCAT44(local_28._4_4_,iVar2 + (int)local_28);
      }
      YVar3.month = in_stack_ffffffffffffffb0;
      YVar3.year = uStack_14;
      YVar3.day = (int)local_28;
      local_10 = (qint64)fixedDate(YVar3,cal_00);
    }
    else {
      QDate((QDate *)in_RDI);
    }
  }
  else {
    QDate((QDate *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDate)local_10;
  }
  __stack_chk_fail();
}

Assistant:

QDate QDate::addYears(int nyears, QCalendar cal) const
{
    if (!isValid())
        return QDate();

    auto parts = cal.partsFromDate(*this);
    if (!parts.isValid())
        return QDate();

    int old_y = parts.year;
    parts.year += nyears;

    // If we just crossed (or hit) a missing year zero, adjust year by ±1:
    if (!cal.hasYearZero() && ((old_y > 0) != (parts.year > 0) || !parts.year))
        parts.year += nyears > 0 ? +1 : -1;

    return fixedDate(parts, cal);
}